

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

int __thiscall CGameClient::GetClientID(CGameClient *this,char *pName)

{
  int iVar1;
  int i;
  ulong uVar2;
  CClientData *a;
  
  a = this->m_aClients;
  uVar2 = 0;
  do {
    if ((a->m_Active == true) && (uVar2 != (uint)this->m_LocalClientID)) {
      iVar1 = str_comp(a->m_aName,pName);
      if (iVar1 == 0) goto LAB_00184c9e;
    }
    uVar2 = uVar2 + 1;
    a = a + 1;
  } while (uVar2 != 0x40);
  uVar2 = 0xffffffff;
LAB_00184c9e:
  return (int)uVar2;
}

Assistant:

int CGameClient::GetClientID(const char *pName)
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_aClients[i].m_Active || i == m_LocalClientID) // skip local user
			continue;

		if(!str_comp(m_aClients[i].m_aName, pName))
			return i;
	}

	return -1;
}